

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDitheringTests.cpp
# Opt level: O1

int __thiscall deqp::gles3::Functional::DitheringTests::init(DitheringTests *this,EVP_PKEY_CTX *ctx)

{
  _func_int **pp_Var1;
  char *pcVar2;
  TestNode *this_00;
  uint uVar3;
  TestNode *node;
  long *plVar4;
  DitheringCase *this_01;
  long *plVar5;
  size_type *psVar6;
  PatternType patternType;
  char *__end;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  TestNode *local_a0;
  ulong local_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string caseName;
  long *local_50 [2];
  long local_40 [2];
  
  if (init()::caseColors == '\0') {
    init((EVP_PKEY_CTX *)this);
  }
  uVar7 = 0;
  local_a0 = (TestNode *)this;
  do {
    this_00 = local_a0;
    node = (TestNode *)operator_new(0x78);
    pp_Var1 = this_00[1]._vptr_TestNode;
    pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
    if ((int)uVar7 != 0) {
      pcVar2 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
    }
    local_98 = uVar7;
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,(TestContext *)*pp_Var1,pcVar2 + 0x27,"");
    node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d1b770;
    node[1]._vptr_TestNode = pp_Var1;
    tcu::TestNode::addChild(this_00,node);
    patternType = PATTERNTYPE_GRADIENT;
    do {
      lVar8 = 0;
      do {
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"","");
        plVar4 = (long *)std::__cxx11::string::append((char *)local_50);
        local_c0 = &local_b0;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_b0 = *plVar5;
          lStack_a8 = plVar4[3];
        }
        else {
          local_b0 = *plVar5;
          local_c0 = (long *)*plVar4;
        }
        local_b8 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_90 = &local_80;
        plVar5 = plVar4 + 2;
        if ((long *)*plVar4 == plVar5) {
          local_80 = *plVar5;
          lStack_78 = plVar4[3];
        }
        else {
          local_80 = *plVar5;
          local_90 = (long *)*plVar4;
        }
        local_88 = plVar4[1];
        *plVar4 = (long)plVar5;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
        caseName._M_dataplus._M_p = (pointer)&caseName.field_2;
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          caseName.field_2._M_allocated_capacity = *psVar6;
          caseName.field_2._8_8_ = plVar4[3];
        }
        else {
          caseName.field_2._M_allocated_capacity = *psVar6;
          caseName._M_dataplus._M_p = (pointer)*plVar4;
        }
        caseName._M_string_length = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        if (local_90 != &local_80) {
          operator_delete(local_90,local_80 + 1);
        }
        if (local_c0 != &local_b0) {
          operator_delete(local_c0,local_b0 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        this_01 = (DitheringCase *)operator_new(0xb0);
        DitheringCase::DitheringCase
                  (this_01,(TestContext *)*local_a0[1]._vptr_TestNode,
                   (RenderContext *)local_a0[1]._vptr_TestNode[1],caseName._M_dataplus._M_p,"",
                   (int)local_98 != 0,patternType,
                   (Vec4 *)((long)init::caseColors[0].color.m_data + lVar8));
        tcu::TestNode::addChild(node,(TestNode *)this_01);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)caseName._M_dataplus._M_p != &caseName.field_2) {
          operator_delete(caseName._M_dataplus._M_p,caseName.field_2._M_allocated_capacity + 1);
        }
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x78);
      bVar9 = patternType == PATTERNTYPE_GRADIENT;
      patternType = patternType + PATTERNTYPE_UNICOLORED_QUAD;
    } while (bVar9);
    uVar3 = (int)local_98 + 1;
    uVar7 = (ulong)uVar3;
  } while ((int)local_98 == 0);
  return uVar3;
}

Assistant:

void DitheringTests::init (void)
{
	static const struct
	{
		const char*		name;
		Vec4			color;
	} caseColors[] =
	{
		{ "white",		Vec4(1.0f, 1.0f, 1.0f, 1.0f) },
		{ "red",		Vec4(1.0f, 0.0f, 0.0f, 1.0f) },
		{ "green",		Vec4(0.0f, 1.0f, 0.0f, 1.0f) },
		{ "blue",		Vec4(0.0f, 0.0f, 1.0f, 1.0f) },
		{ "alpha",		Vec4(0.0f, 0.0f, 0.0f, 1.0f) }
	};

	for (int ditheringEnabledI = 0; ditheringEnabledI <= 1; ditheringEnabledI++)
	{
		const bool				ditheringEnabled	= ditheringEnabledI != 0;
		TestCaseGroup* const	group				= new TestCaseGroup(m_context, ditheringEnabled ? "enabled" : "disabled", "");
		addChild(group);

		for (int patternTypeI = 0; patternTypeI < DitheringCase::PATTERNTYPE_LAST; patternTypeI++)
		{
			for (int caseColorNdx = 0; caseColorNdx < DE_LENGTH_OF_ARRAY(caseColors); caseColorNdx++)
			{
				const DitheringCase::PatternType	patternType		= (DitheringCase::PatternType)patternTypeI;
				const string						caseName		= string("") + DitheringCase::getPatternTypeName(patternType) + "_" + caseColors[caseColorNdx].name;

				group->addChild(new DitheringCase(m_context.getTestContext(), m_context.getRenderContext(), caseName.c_str(), "", ditheringEnabled, patternType, caseColors[caseColorNdx].color));
			}
		}
	}
}